

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.cpp
# Opt level: O2

options * parse(options *__return_storage_ptr__,options *opt,int *ptr,char **argv,int argc)

{
  bool bVar1;
  undefined6 uVar2;
  int iVar3;
  symbol *psVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  char *pcVar6;
  allocator local_1f5;
  int block_size;
  string s;
  allocator local_1d0 [32];
  string sep;
  
  std::__cxx11::string::string((string *)&s,argv[*ptr],(allocator *)&sep);
  *ptr = *ptr + 1;
  iVar3 = std::__cxx11::string::compare((char *)&s);
  if (iVar3 == 0) {
    opt->lz_variant = v1;
LAB_0010c801:
    __return_storage_ptr__->mode = opt->mode;
    __return_storage_ptr__->verbose = opt->verbose;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = *(undefined2 *)&opt->field_0x5;
    __return_storage_ptr__->field_0x7 = opt->field_0x7;
    __return_storage_ptr__->lz_variant = opt->lz_variant;
    *(undefined4 *)&__return_storage_ptr__->field_0xc = *(undefined4 *)&opt->field_0xc;
    __return_storage_ptr__->block = opt->block;
    bVar1 = opt->prepend_alphabet;
    uVar2 = *(undefined6 *)&opt->field_0x1a;
    __return_storage_ptr__->sep = opt->sep;
    __return_storage_ptr__->prepend_alphabet = bVar1;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = uVar2;
    std::__cxx11::string::~string((string *)&s);
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)&s);
  if (iVar3 == 0) {
    opt->lz_variant = v2;
    goto LAB_0010c801;
  }
  iVar3 = std::__cxx11::string::compare((char *)&s);
  if (iVar3 == 0) {
    if (*ptr < argc) {
      std::__cxx11::string::string((string *)local_1d0,argv[*ptr],&local_1f5);
      std::__cxx11::istringstream::istringstream((istringstream *)&sep,(string *)local_1d0,_S_in);
      std::istream::operator>>((istream *)&sep,&block_size);
      std::__cxx11::istringstream::~istringstream((istringstream *)&sep);
      std::__cxx11::string::~string((string *)local_1d0);
      if (0 < (long)block_size) {
        opt->block = (long)block_size;
        *ptr = *ptr + 1;
        goto LAB_0010c801;
      }
      goto LAB_0010c8cd;
    }
LAB_0010c8ad:
    pcVar6 = "Missing block size in option --p";
LAB_0010c8b4:
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar6);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&s);
    if (iVar3 == 0) {
      opt->verbose = true;
      goto LAB_0010c801;
    }
    iVar3 = std::__cxx11::string::compare((char *)&s);
    if (iVar3 == 0) {
      if (*ptr < argc) {
        std::__cxx11::string::string((string *)&sep,argv[*ptr],local_1d0);
        if (sep._M_string_length == 1) {
          psVar4 = (symbol *)std::__cxx11::string::at((ulong)&sep);
          opt->sep = *psVar4;
          *ptr = *ptr + 1;
          std::__cxx11::string::~string((string *)&sep);
          goto LAB_0010c801;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Error: separator must be a single character.");
        std::endl<char,std::char_traits<char>>(poVar5);
        help();
        goto LAB_0010c8ad;
      }
      pcVar6 = "Missing separator character in option --s";
      goto LAB_0010c8b4;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Unrecognized option ");
    poVar5 = std::operator<<(poVar5,(string *)&s);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::endl<char,std::char_traits<char>>(poVar5);
  help();
LAB_0010c8cd:
  poVar5 = std::operator<<((ostream *)&std::cout,"error: block size in --p must be > 0");
  std::endl<char,std::char_traits<char>>(poVar5);
  help();
  std::__cxx11::string::~string((string *)&s);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

lz77_t::options parse(lz77_t::options &opt, int &ptr, char** argv, int argc){

	string s(argv[ptr]);
	ptr++;

	if(s.compare("--v1")==0){

		opt.lz_variant = lz77_t::v1;

	}else if(s.compare("--v2")==0){

		opt.lz_variant = lz77_t::v2;

	}else if(s.compare("--p")==0){

		if(ptr>=argc){
			cout<<"Missing block size in option --p" << endl;
			help();
		}

		int block_size;
		istringstream ( string(argv[ptr]) ) >> block_size;

		if(block_size<=0){
			cout << "error: block size in --p must be > 0" << endl;
			help();
		}

		opt.block=block_size;

		ptr++;

	}else if(s.compare("--verbose")==0){

		opt.verbose = true;

	}else if(s.compare("--s")==0){

		if(ptr>=argc){
			cout<<"Missing separator character in option --s" << endl;
			help();
		}

		string sep(argv[ptr]);

		if(sep.length()!=1){
			cout << "Error: separator must be a single character." << endl;
			help();
		}

		opt.sep = sep.at(0);
		ptr++;

	}else{

		cout << "Unrecognized option " << s<< endl << endl;
		help();
	}

	return opt;
}